

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodet.cpp
# Opt level: O2

void generate_proposals(Mat *cls_pred,Mat *dis_pred,int stride,Mat *in_pad,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  int iVar1;
  Layer *pLVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar17;
  float pred_ltrb [4];
  void *local_128;
  int *local_120;
  long local_118;
  undefined4 local_110;
  long *local_108;
  undefined4 local_100;
  int local_fc;
  undefined8 local_f8;
  undefined4 local_f0;
  long local_e8;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  Mat *local_c0;
  vector<Object,_std::allocator<Object>_> *local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Option opt;
  
  if (in_pad->h < in_pad->w) {
    uVar7 = in_pad->w / stride;
    uVar10 = cls_pred->h / (int)uVar7;
  }
  else {
    uVar10 = in_pad->h / stride;
    uVar7 = cls_pred->h / (int)uVar10;
  }
  uVar12 = (long)dis_pred->w / 4;
  iVar1 = (int)uVar12;
  fVar17 = (float)stride;
  local_98 = 0;
  uVar13 = (ulong)(uint)cls_pred->w;
  if (cls_pred->w < 1) {
    uVar13 = local_98;
  }
  local_b0 = (long)iVar1 * 4;
  uVar12 = uVar12 & 0xffffffff;
  if (iVar1 < 1) {
    uVar12 = local_98;
  }
  uVar8 = 0;
  if (0 < (int)uVar7) {
    uVar8 = (ulong)uVar7;
  }
  local_d8 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    local_d8 = local_98;
  }
  local_e0 = (long)(int)uVar7;
  local_c8 = uVar8;
  local_c0 = cls_pred;
  local_b8 = objects;
  for (uVar9 = 0; uVar9 != local_d8; uVar9 = uVar9 + 1) {
    lVar11 = uVar9 * local_e0;
    local_88 = ((float)(int)uVar9 + 0.5) * fVar17;
    local_d0 = local_98;
    local_a8 = lVar11;
    local_a0 = uVar9;
    uStack_84 = in_XMM0_Db;
    uStack_80 = in_XMM0_Dc;
    uStack_7c = in_XMM0_Dd;
    for (uVar6 = 0; fVar15 = -3.4028235e+38, uVar6 != uVar8; uVar6 = uVar6 + 1) {
      uVar14 = 0xffffffff;
      for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
        fVar16 = *(float *)((long)cls_pred->data +
                           uVar4 * 4 + cls_pred->elemsize * local_98 * (long)cls_pred->w);
        in_XMM0_Db = 0;
        in_XMM0_Dc = 0;
        in_XMM0_Dd = 0;
        if (fVar15 < fVar16) {
          uVar14 = uVar4 & 0xffffffff;
          fVar15 = fVar16;
        }
      }
      if (0.4 <= fVar15) {
        local_128 = (void *)((lVar11 + uVar6) * (long)dis_pred->w * dis_pred->elemsize +
                            (long)dis_pred->data);
        local_120 = (int *)0x0;
        local_118 = 4;
        local_110 = 1;
        local_108 = (long *)0x0;
        local_100 = 2;
        local_f8 = 0x100000004;
        local_e8 = local_b0;
        local_fc = iVar1;
        local_f0 = local_110;
        local_90 = uVar6;
        pLVar2 = ncnn::create_layer("Softmax");
        ncnn::ParamDict::ParamDict((ParamDict *)pred_ltrb);
        ncnn::ParamDict::set((ParamDict *)pred_ltrb,0,1);
        ncnn::ParamDict::set((ParamDict *)pred_ltrb,1,1);
        (*pLVar2->_vptr_Layer[2])(pLVar2,(ParamDict *)pred_ltrb);
        ncnn::Option::Option(&opt);
        opt.num_threads = 1;
        opt.use_packing_layout = false;
        (*pLVar2->_vptr_Layer[4])(pLVar2,&opt);
        (*pLVar2->_vptr_Layer[9])(pLVar2,&local_128,&opt);
        (*pLVar2->_vptr_Layer[5])(pLVar2);
        (*pLVar2->_vptr_Layer[1])(pLVar2);
        ncnn::ParamDict::~ParamDict((ParamDict *)pred_ltrb);
        uVar6 = local_90;
        lVar11 = local_fc * local_118;
        pvVar3 = local_128;
        for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
          fVar16 = 0.0;
          for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
            fVar16 = fVar16 + (float)(int)uVar8 * *(float *)((long)pvVar3 + uVar8 * 4);
          }
          pred_ltrb[lVar5] = fVar16 * fVar17;
          pvVar3 = (void *)((long)pvVar3 + lVar11);
        }
        fVar16 = ((float)(int)uVar6 + 0.5) * fVar17;
        opt._0_4_ = fVar16 - (float)pred_ltrb._0_8_;
        opt.num_threads = (int)(local_88 - SUB84(pred_ltrb._0_8_,4));
        opt.blob_allocator._0_4_ = ((float)pred_ltrb._8_8_ + fVar16) - (float)opt._0_4_;
        opt.blob_allocator._4_4_ = (SUB84(pred_ltrb._8_8_,4) + local_88) - (float)opt.num_threads;
        opt.workspace_allocator._0_4_ = (undefined4)uVar14;
        opt.workspace_allocator._4_4_ = fVar15;
        std::vector<Object,_std::allocator<Object>_>::push_back(local_b8,(value_type *)&opt);
        cls_pred = local_c0;
        uVar8 = local_c8;
        uVar9 = local_a0;
        lVar11 = local_a8;
        in_XMM0_Db = extraout_XMM0_Db;
        in_XMM0_Dc = extraout_XMM0_Dc;
        in_XMM0_Dd = extraout_XMM0_Dd;
        if (local_120 != (int *)0x0) {
          LOCK();
          *local_120 = *local_120 + -1;
          UNLOCK();
          if (*local_120 == 0) {
            if (local_108 == (long *)0x0) {
              free(local_128);
              cls_pred = local_c0;
              uVar8 = local_c8;
              uVar9 = local_a0;
              lVar11 = local_a8;
              in_XMM0_Db = extraout_XMM0_Db_01;
              in_XMM0_Dc = extraout_XMM0_Dc_01;
              in_XMM0_Dd = extraout_XMM0_Dd_01;
            }
            else {
              (**(code **)(*local_108 + 0x18))();
              cls_pred = local_c0;
              uVar8 = local_c8;
              uVar9 = local_a0;
              lVar11 = local_a8;
              in_XMM0_Db = extraout_XMM0_Db_00;
              in_XMM0_Dc = extraout_XMM0_Dc_00;
              in_XMM0_Dd = extraout_XMM0_Dd_00;
            }
          }
        }
      }
      local_98 = local_98 + 1;
    }
    local_98 = local_d0 + local_e0;
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& cls_pred, const ncnn::Mat& dis_pred, int stride, const ncnn::Mat& in_pad, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = cls_pred.h;

    int num_grid_x;
    int num_grid_y;
    if (in_pad.w > in_pad.h)
    {
        num_grid_x = in_pad.w / stride;
        num_grid_y = num_grid / num_grid_x;
    }
    else
    {
        num_grid_y = in_pad.h / stride;
        num_grid_x = num_grid / num_grid_y;
    }

    const int num_class = cls_pred.w;
    const int reg_max_1 = dis_pred.w / 4;

    for (int i = 0; i < num_grid_y; i++)
    {
        for (int j = 0; j < num_grid_x; j++)
        {
            const int idx = i * num_grid_x + j;

            const float* scores = cls_pred.row(idx);

            // find label with max score
            int label = -1;
            float score = -FLT_MAX;
            for (int k = 0; k < num_class; k++)
            {
                if (scores[k] > score)
                {
                    label = k;
                    score = scores[k];
                }
            }

            if (score >= prob_threshold)
            {
                ncnn::Mat bbox_pred(reg_max_1, 4, (void*)dis_pred.row(idx));
                {
                    ncnn::Layer* softmax = ncnn::create_layer("Softmax");

                    ncnn::ParamDict pd;
                    pd.set(0, 1); // axis
                    pd.set(1, 1);
                    softmax->load_param(pd);

                    ncnn::Option opt;
                    opt.num_threads = 1;
                    opt.use_packing_layout = false;

                    softmax->create_pipeline(opt);

                    softmax->forward_inplace(bbox_pred, opt);

                    softmax->destroy_pipeline(opt);

                    delete softmax;
                }

                float pred_ltrb[4];
                for (int k = 0; k < 4; k++)
                {
                    float dis = 0.f;
                    const float* dis_after_sm = bbox_pred.row(k);
                    for (int l = 0; l < reg_max_1; l++)
                    {
                        dis += l * dis_after_sm[l];
                    }

                    pred_ltrb[k] = dis * stride;
                }

                float pb_cx = (j + 0.5f) * stride;
                float pb_cy = (i + 0.5f) * stride;

                float x0 = pb_cx - pred_ltrb[0];
                float y0 = pb_cy - pred_ltrb[1];
                float x1 = pb_cx + pred_ltrb[2];
                float y1 = pb_cy + pred_ltrb[3];

                Object obj;
                obj.rect.x = x0;
                obj.rect.y = y0;
                obj.rect.width = x1 - x0;
                obj.rect.height = y1 - y0;
                obj.label = label;
                obj.prob = score;

                objects.push_back(obj);
            }
        }
    }
}